

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decay.c
# Opt level: O2

void duckdb_je_decay_deadline_init(decay_t *decay)

{
  nstime_t *time;
  long lVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t ns;
  nstime_t jitter;
  nstime_t local_20;
  
  time = &decay->deadline;
  duckdb_je_nstime_copy(time,&decay->epoch);
  duckdb_je_nstime_add(time,&decay->interval);
  if (0 < (decay->time_ms).repr) {
    uVar2 = duckdb_je_nstime_ns(&decay->interval);
    if (uVar2 == 1) {
      ns = 0;
    }
    else {
      lVar1 = 0x3f;
      if (uVar2 - 1 != 0) {
        for (; uVar2 - 1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar3 = decay->jitter_state;
      do {
        uVar3 = uVar3 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        ns = uVar3 >> (((byte)lVar1 ^ 0x3f) & 0x3f);
      } while (uVar2 <= ns);
      decay->jitter_state = uVar3;
    }
    duckdb_je_nstime_init(&local_20,ns);
    duckdb_je_nstime_add(time,&local_20);
  }
  return;
}

Assistant:

static void
decay_deadline_init(decay_t *decay) {
	nstime_copy(&decay->deadline, &decay->epoch);
	nstime_add(&decay->deadline, &decay->interval);
	if (decay_ms_read(decay) > 0) {
		nstime_t jitter;

		nstime_init(&jitter, prng_range_u64(&decay->jitter_state,
		    nstime_ns(&decay->interval)));
		nstime_add(&decay->deadline, &jitter);
	}
}